

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.h
# Opt level: O0

void __thiscall iqxmlrpc::Method::Method(Method *this)

{
  Method *this_local;
  
  this->_vptr_Method = (_func_int **)&PTR__Method_00251968;
  Data::Data(&this->data_);
  std::__cxx11::string::string((string *)&this->authname_);
  XHeaders::XHeaders(&this->xheaders_);
  return;
}

Assistant:

class LIBIQXMLRPC_API Method {
public:
  struct Data {
    std::string      method_name;
    iqnet::Inet_addr peer_addr;
    Server_feedback  server_face;
  };

private:
  friend class Method_dispatcher_base;
  Data data_;
  std::string authname_;
  XHeaders xheaders_;

public:
  virtual ~Method() {}

  //! Calls customized execute() and optionally wraps it with interceptors.
  //! Is is called by a server object.
  void process_execution(Interceptor*, const Param_list& params, Value& response);

  const std::string&      name()      const { return data_.method_name; }
  const iqnet::Inet_addr& peer_addr() const { return data_.peer_addr; }
  Server_feedback&        server()          { return data_.server_face; }

  bool                    authenticated() const { return !authname_.empty(); }
  const std::string&      authname()      const { return authname_; }
  void                    authname(const std::string& n) { authname_ = n; }

  XHeaders&               xheaders() { return xheaders_; }

private:
  //! Replace it with your actual code.
  virtual void execute( const Param_list& params, Value& response ) = 0;
}